

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_AddExt_Test::TestBody(X509Test_AddExt_Test *this)

{
  pointer *this_00;
  allocator_type *paVar1;
  long lVar2;
  char *pcVar3;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<Extension> __l_03;
  initializer_list<Extension> __l_04;
  initializer_list<Extension> __l_05;
  initializer_list<Extension> __l_06;
  initializer_list<Extension> __l_07;
  initializer_list<Extension> __l_08;
  initializer_list<Extension> __l_09;
  initializer_list<Extension> __l_10;
  initializer_list<Extension> __l_11;
  initializer_list<Extension> __l_12;
  initializer_list<Extension> __l_13;
  initializer_list<Extension> __l_14;
  initializer_list<Extension> __l_15;
  initializer_list<Extension> __l_16;
  initializer_list<Extension> __l_17;
  initializer_list<Extension> __l_18;
  initializer_list<Extension> __l_19;
  AssertHelper local_138;
  vector<Extension,_std::allocator<Extension>_> local_130;
  UniquePtr<X509> x509;
  anon_class_8_1_89930684 expect_extensions;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  undefined4 local_c8;
  undefined1 local_c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> skid2_der;
  vector<unsigned_char,_std::allocator<unsigned_char>_> skid1_der;
  UniquePtr<BASIC_CONSTRAINTS> basic1_obj;
  uint8_t *inp;
  UniquePtr<BASIC_CONSTRAINTS> basic2_obj;
  vector<unsigned_char,_std::allocator<unsigned_char>_> basic2_der;
  vector<unsigned_char,_std::allocator<unsigned_char>_> basic1_der;
  UniquePtr<ASN1_OCTET_STRING> skid2_obj;
  UniquePtr<ASN1_OCTET_STRING> skid1_obj;
  
  x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl = (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)X509_new();
  this_00 = &basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (tuple<x509_st_*,_bssl::internal::Deleter>)
       x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_x509_st_*,_false>)0x0;
  if ((tuple<x509_st_*,_bssl::internal::Deleter>)
      x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl == (_Head_base<0UL,_x509_st_*,_false>)0x0
     ) {
    testing::Message::Message((Message *)&basic2_der);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&basic1_der,(AssertionResult *)0x4fd530,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&skid1_der,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1593,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&skid1_der,(Message *)&basic2_der);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&skid1_der);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)basic2_der.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    expect_extensions.x509 = &x509;
    gtest_ar._0_2_ = 0x30;
    __l._M_len = 2;
    __l._M_array = &gtest_ar.success_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&basic1_der,__l,(allocator_type *)&basic2_der);
    inp = (uint8_t *)
          CONCAT71(basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                   basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start._0_1_);
    basic1_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter,_true,_true>)
         d2i_BASIC_CONSTRAINTS
                   ((BASIC_CONSTRAINTS **)0x0,&inp,
                    (long)basic1_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)inp);
    basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)&gtest_ar,"inp","basic1_der.data() + basic1_der.size()",&inp,
               (uchar **)&basic2_der);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&basic2_der);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&skid1_der,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15ae,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&skid1_der,(Message *)&basic2_der);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&skid1_der);
      if (basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)basic2_der.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0xff01010330;
    __l_00._M_len = 5;
    __l_00._M_array = &gtest_ar.success_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&basic2_der,__l_00,(allocator_type *)&skid1_der);
    inp = basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    basic2_obj._M_t.super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter,_true,_true>)
         d2i_BASIC_CONSTRAINTS
                   ((BASIC_CONSTRAINTS **)0x0,&inp,
                    (long)basic2_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)basic2_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)&gtest_ar,"inp","basic2_der.data() + basic2_der.size()",&inp,
               (uchar **)&skid1_der);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&skid1_der);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&skid2_der,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15b5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&skid2_der,(Message *)&skid1_der);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&skid2_der);
      if (skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)skid1_der.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_2_ = 4;
    __l_01._M_len = 2;
    __l_01._M_array = &gtest_ar.success_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&skid1_der,__l_01,(allocator_type *)&skid2_der);
    inp = skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    skid1_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         d2i_ASN1_OCTET_STRING
                   ((ASN1_OCTET_STRING **)0x0,&inp,
                    (long)skid1_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)skid1_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)&gtest_ar,"inp","skid1_der.data() + skid1_der.size()",&inp,
               (uchar **)&skid2_der);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&skid2_der);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15bc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&skid2_der);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
      if (skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)skid2_der.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_3_ = 0x610104;
    __l_02._M_len = 3;
    __l_02._M_array = &gtest_ar.success_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&skid2_der,__l_02,(allocator_type *)&local_130);
    inp = skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    skid2_obj._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         d2i_ASN1_OCTET_STRING
                   ((ASN1_OCTET_STRING **)0x0,&inp,
                    (long)skid2_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)skid2_der.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)&gtest_ar,"inp","skid2_der.data() + skid2_der.size()",&inp,
               (uchar **)&local_130);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15c3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    TestBody::anon_class_8_1_89930684::operator()
              (&expect_extensions,(vector<Extension,_std::allocator<Extension>_> *)&gtest_ar);
    std::vector<Extension,_std::allocator<Extension>_>::~vector
              ((vector<Extension,_std::allocator<Extension>_> *)&gtest_ar);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic1_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,1,0);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 0L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15cb;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15cb,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000057;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &basic1_der);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_03,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x52,
                           (void *)skid1_obj._M_t.
                                   super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,0,0)
    ;
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 82, skid1_obj.get(), 0, 0L)"
               ,(int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15cf;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15cf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000057;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &basic1_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&skid1_der);
    __l_04._M_len = 2;
    __l_04._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_04,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic2_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,0,0);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 0L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15d6;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15d6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000057;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &basic1_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&skid1_der);
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_05,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic2_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,0,4);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 4L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15de;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15de,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000057;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &basic1_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&skid1_der);
    __l_06._M_len = 2;
    __l_06._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_06,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic2_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,0,2);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 2L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15e5;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15e5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x57;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &basic2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&skid1_der);
    __l_07._M_len = 2;
    __l_07._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_07,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x52,
                           (void *)skid2_obj._M_t.
                                   super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,1,3)
    ;
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 82, skid2_obj.get(), 1, 3L)"
               ,(int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15ec;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15ec,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x57;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &basic2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&skid2_der);
    __l_08._M_len = 2;
    __l_08._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_08,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)0x0,0,5);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15f2;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15f2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_09,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)0x0,0,5);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15f7;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15f7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_10,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic1_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,1,3);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 3L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x15fd;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15fd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    __l_11._M_len = 1;
    __l_11._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_11,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic1_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,1,2);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 2L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x1603;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1603,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&basic1_der);
    __l_12._M_len = 2;
    __l_12._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_12,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)0x0,0,5);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x1609;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1609,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    __l_13._M_len = 1;
    __l_13._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_13,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic1_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,1,4);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 4L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x160f;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x160f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&basic1_der);
    __l_14._M_len = 2;
    __l_14._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_14,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)0x0,0,5);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x1615;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1615,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    __l_15._M_len = 1;
    __l_15._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_15,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic1_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,1,1);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 1L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x161b;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x161b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&basic1_der);
    __l_16._M_len = 2;
    __l_16._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_16,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)basic2_obj._M_t.
                                   super___uniq_ptr_impl<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BASIC_CONSTRAINTS_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false>.
                                   _M_head_impl,0,1);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 1L)",(int *)paVar1,
               (int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x1622;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1622,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&basic1_der);
    local_c8 = 0x57;
    local_c4 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c0,&basic2_der);
    __l_17._M_len = 3;
    __l_17._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_17,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x48;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)0x0,0,5);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x1629;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1629,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e0,&basic2_der);
    __l_18._M_len = 2;
    __l_18._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_18,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar2 = 0x28;
    do {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (&gtest_ar.success_ + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x18);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x57,
                           (void *)0x0,0,5);
    paVar1 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar1,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_130);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      paVar1 = (allocator_type *)0x162d;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x162d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar._0_5_ = 0x100000052;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
               &skid2_der);
    __l_19._M_len = 1;
    __l_19._M_array = (iterator)&gtest_ar;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_19,paVar1);
    TestBody::anon_class_8_1_89930684::operator()(&expect_extensions,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&skid2_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&skid2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&skid1_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&skid1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr(&basic2_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&basic2_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr(&basic1_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&basic1_der.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&x509);
  return;
}

Assistant:

TEST(X509Test, AddExt) {
  bssl::UniquePtr<X509> x509(X509_new());
  ASSERT_TRUE(x509);

  struct Extension {
    int nid;
    bool critical;
    std::vector<uint8_t> data;
  };
  auto expect_extensions = [&](const std::vector<Extension> &exts) {
    ASSERT_EQ(static_cast<size_t>(X509_get_ext_count(x509.get())), exts.size());
    for (size_t i = 0; i < exts.size(); i++) {
      SCOPED_TRACE(i);
      const X509_EXTENSION *ext = X509_get_ext(x509.get(), static_cast<int>(i));
      EXPECT_EQ(OBJ_obj2nid(X509_EXTENSION_get_object(ext)), exts[i].nid);
      EXPECT_EQ(X509_EXTENSION_get_critical(ext), exts[i].critical ? 1 : 0);
      const ASN1_OCTET_STRING *data = X509_EXTENSION_get_data(ext);
      EXPECT_EQ(Bytes(ASN1_STRING_get0_data(data), ASN1_STRING_length(data)),
                Bytes(exts[i].data));
    }
  };

  // Make a few sample extensions.

  // SEQUENCE {}
  std::vector<uint8_t> basic1_der = {0x30, 0x00};
  const uint8_t *inp = basic1_der.data();
  bssl::UniquePtr<BASIC_CONSTRAINTS> basic1_obj(
      d2i_BASIC_CONSTRAINTS(nullptr, &inp, basic1_der.size()));
  EXPECT_EQ(inp, basic1_der.data() + basic1_der.size());

  // SEQUENCE { BOOLEAN { TRUE } }
  std::vector<uint8_t> basic2_der = {0x30, 0x03, 0x01, 0x01, 0xff};
  inp = basic2_der.data();
  bssl::UniquePtr<BASIC_CONSTRAINTS> basic2_obj(
      d2i_BASIC_CONSTRAINTS(nullptr, &inp, basic2_der.size()));
  EXPECT_EQ(inp, basic2_der.data() + basic2_der.size());

  // OCTET_STRING {}
  std::vector<uint8_t> skid1_der = {0x04, 0x00};
  inp = skid1_der.data();
  bssl::UniquePtr<ASN1_OCTET_STRING> skid1_obj(
      d2i_ASN1_OCTET_STRING(nullptr, &inp, skid1_der.size()));
  EXPECT_EQ(inp, skid1_der.data() + skid1_der.size());

  // OCTET_STRING { "a" }
  std::vector<uint8_t> skid2_der = {0x04, 0x01, 0x61};
  inp = skid2_der.data();
  bssl::UniquePtr<ASN1_OCTET_STRING> skid2_obj(
      d2i_ASN1_OCTET_STRING(nullptr, &inp, skid2_der.size()));
  EXPECT_EQ(inp, skid2_der.data() + skid2_der.size());

  // Initially, the extension list is empty.
  expect_extensions({});

  // Adding extensions works with the default settings.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der}});
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_subject_key_identifier,
                                 skid1_obj.get(),
                                 /*crit=*/0, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // By default, we cannot add duplicates.
  EXPECT_EQ(
      0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_KEEP_EXISTING| silently keeps the existing extension if already
  // present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_KEEP_EXISTING));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_REPLACE| replaces it.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_REPLACE));
  expect_extensions({{NID_basic_constraints, false, basic2_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_REPLACE_EXISTING| also replaces matches.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_subject_key_identifier,
                                 skid2_obj.get(),
                                 /*crit=*/1, X509V3_ADD_REPLACE_EXISTING));
  expect_extensions({{NID_basic_constraints, false, basic2_der},
                     {NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_DELETE| ignores the value and deletes the extension.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // Not finding an extension to delete is an error.
  EXPECT_EQ(0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_REPLACE_EXISTING| fails if it cannot find a match.
  EXPECT_EQ(
      0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_REPLACE_EXISTING));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_REPLACE| adds a new extension if not preseent.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_REPLACE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // Delete the extension again.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_KEEP_EXISTING| adds a new extension if not preseent.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_KEEP_EXISTING));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // Delete the extension again.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_APPEND| adds a new extension if not present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_APPEND));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // |X509V3_ADD_APPEND| keeps adding duplicates (invalid) even if present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_APPEND));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der},
                     {NID_basic_constraints, false, basic2_der}});

  // |X509V3_ADD_DELETE| only deletes one extension at a time.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, false, basic2_der}});
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});
}